

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

_Bool x86_cpu_tlb_fill_x86_64
                (CPUState *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  int iVar1;
  CPUX86State *env;
  X86CPU *cpu;
  _Bool probe_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  vaddr addr_local;
  CPUState *cs_local;
  
  cs[1].tb_jmp_cache[0x39e] = (TranslationBlock *)retaddr;
  iVar1 = handle_mmu_fault(cs,addr,size,access_type,mmu_idx);
  if (iVar1 == 0) {
    return true;
  }
  if (!probe) {
    raise_exception_err_ra_x86_64
              ((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb),cs->exception_index,
               *(int *)(cs[1].tb_jmp_cache + 0x388),retaddr);
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/excp_helper.c"
             ,0x2ad,"!probe");
}

Assistant:

bool x86_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;

    env->retaddr = retaddr;
    if (handle_mmu_fault(cs, addr, size, access_type, mmu_idx)) {
        /* FIXME: On error in get_hphys we have already jumped out.  */
        g_assert(!probe);
        raise_exception_err_ra(env, cs->exception_index,
                               env->error_code, retaddr);
    }
    return true;
}